

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall
TorController::protocolinfo_cb
          (TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  long lVar1;
  pointer pbVar2;
  pointer puVar3;
  bool bVar4;
  iterator iVar5;
  TorController *pTVar6;
  size_type sVar7;
  Level LVar8;
  char *pcVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar10;
  TorControlConnection *category;
  TorController *category_00;
  TorController *pTVar11;
  int source_line;
  undefined8 in_R8;
  pointer s;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  Span<unsigned_char> bytes;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view str;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  Span<const_unsigned_char> s_00;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
  local_180;
  ReplyHandlerCB local_168;
  string torpassword;
  _Any_data local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  l;
  string cookiefile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  methods;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (reply->code != 0xfa) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      logging_function_00._M_str = "protocolinfo_cb";
      logging_function_00._M_len = 0xf;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_00._M_len = 0x5e;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,0x265,ALL,Info,
                 (ConstevalFormatString<0U>)0x6c0b9f);
      return;
    }
    goto LAB_00337373;
  }
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &methods._M_t._M_impl.super__Rb_tree_header._M_header;
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  methods._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cookiefile._M_dataplus._M_p = (pointer)&cookiefile.field_2;
  cookiefile._M_string_length = 0;
  cookiefile.field_2._M_local_buf[0] = '\0';
  pbVar2 = (reply->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar9 = (char *)_conn;
  category_00 = this;
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (s = (reply->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pTVar11 = (TorController *)methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      s != pbVar2; s = s + 1) {
    SplitTorReplyLine(&l,s);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l,
                            "AUTH");
    if (bVar4) {
      ParseTorReplyMapping
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&m._M_t,&l.second);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"METHODS",(allocator<char> *)&torpassword);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&m._M_t,(key_type *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      if ((_Rb_tree_header *)iVar5._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
        str._M_str = (char *)0x2c;
        str._M_len = *(size_t *)(iVar5._M_node + 2);
        util::SplitString_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&torpassword,(util *)iVar5._M_node[2]._M_parent,str,(char)in_R8);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_128,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )torpassword._M_dataplus._M_p,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )torpassword._M_string_length);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&methods._M_t,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_128);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_128);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&torpassword);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"COOKIEFILE",(allocator<char> *)&torpassword);
      pcVar9 = (char *)&local_128;
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&m._M_t,(key_type *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      if ((_Rb_tree_header *)iVar5._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
        pcVar9 = (char *)(iVar5._M_node + 2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&cookiefile,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar9);
      }
LAB_00336992:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&m._M_t);
    }
    else {
      pcVar9 = "VERSION";
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &l,"VERSION");
      if (bVar4) {
        ParseTorReplyMapping
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&m._M_t,&l.second);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"Tor",(allocator<char> *)&torpassword);
        pcVar9 = (char *)&local_128;
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&m._M_t,(key_type *)&local_128);
        category = (TorControlConnection *)&local_128;
        std::__cxx11::string::~string((string *)&local_128);
        if (((_Rb_tree_header *)iVar5._M_node != &m._M_t._M_impl.super__Rb_tree_header) &&
           (bVar4 = ::LogAcceptCategory((LogFlags)category,(Level)pcVar9), bVar4)) {
          in_R8 = 0x236;
          logging_function._M_str = "protocolinfo_cb";
          logging_function._M_len = 0xf;
          pcVar9 = "protocolinfo_cb";
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file._M_len = 0x5e;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,0x236,TOR,Debug,
                     (ConstevalFormatString<1U>)0x6c08e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (iVar5._M_node + 2));
        }
        goto LAB_00336992;
      }
    }
    category_00 = (TorController *)&l;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&l);
  }
  while (pTVar11 != (TorController *)&methods._M_t._M_impl.super__Rb_tree_header) {
    bVar4 = ::LogAcceptCategory((LogFlags)category_00,(Level)pcVar9);
    if (bVar4) {
      logging_function_01._M_str = "protocolinfo_cb";
      logging_function_01._M_len = 0xf;
      pcVar9 = "protocolinfo_cb";
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_01._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_01,source_file_01,0x23b,TOR,Debug,
                 (ConstevalFormatString<1U>)0x6c0905,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pTVar11->m_tor_control_center).field_2 + 8));
    }
    pTVar6 = (TorController *)std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar11);
    category_00 = pTVar11;
    pTVar11 = pTVar6;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&l,"-torpassword",(allocator<char> *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>((string *)&m,"",(allocator<char> *)&local_168);
  ArgsManager::GetArg(&torpassword,&gArgs,&l.first,(string *)&m);
  std::__cxx11::string::~string((string *)&m);
  std::__cxx11::string::~string((string *)&l);
  if (torpassword._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&l,"NULL",(allocator<char> *)&m);
    ppVar10 = &l;
    sVar7 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&methods,&ppVar10->first);
    LVar8 = (Level)ppVar10;
    ppVar10 = &l;
    std::__cxx11::string::~string((string *)ppVar10);
    if (sVar7 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&l,"SAFECOOKIE",(allocator<char> *)&m);
      ppVar10 = &l;
      sVar7 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&methods,&ppVar10->first);
      LVar8 = (Level)ppVar10;
      ppVar10 = &l;
      std::__cxx11::string::~string((string *)ppVar10);
      if (sVar7 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&l,"HASHEDPASSWORD",(allocator<char> *)&m);
        sVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&methods,&l.first);
        std::__cxx11::string::~string((string *)&l);
        bVar4 = sVar7 == 0;
        source_line = bVar4 + 0x260 + (uint)bVar4;
        pcVar9 = 
        "tor: The only supported authentication mechanism left is password, but no password provided with -torpassword\n"
        ;
        if (bVar4) {
          pcVar9 = "tor: No supported authentication method\n";
        }
        goto LAB_00336d6c;
      }
      bVar4 = ::LogAcceptCategory((LogFlags)ppVar10,LVar8);
      if (bVar4) {
        logging_function_05._M_str = "protocolinfo_cb";
        logging_function_05._M_len = 0xf;
        source_file_05._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_05._M_len = 0x5e;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_05,source_file_05,0x250,TOR,Debug,
                   (ConstevalFormatString<1U>)0x6c0a0b,&cookiefile);
      }
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&l,&cookiefile,auto_format);
      std::filesystem::__cxx11::path::path((path *)&local_128,(path *)&l);
      std::filesystem::__cxx11::path::~path((path *)&l);
      ReadBinaryFile_abi_cxx11_
                ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&m,(path *)&local_128,0x20);
      std::filesystem::__cxx11::path::~path((path *)&local_128);
      if (m._M_t._M_impl._0_1_ == '\x01') {
        if (m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x20) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&l,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )m._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                     (char *)(m._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x20),
                     (allocator_type *)&local_128);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&this->cookie,&l);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&l);
          local_128._M_unused._M_member_pointer =
               local_128._M_unused._M_member_pointer & 0xffffffffffffff00;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&l,0x20,
                     (value_type_conflict *)local_128._M_pod_data,(allocator_type *)&local_168);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&this->clientNonce,&l);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&l);
          puVar3 = (this->clientNonce).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bytes.m_size = (long)(this->clientNonce).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
          bytes.m_data = puVar3;
          GetRandBytes(bytes);
          puVar3 = (this->clientNonce).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          s_00.m_size = (long)(this->clientNonce).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
          s_00.m_data = puVar3;
          HexStr_abi_cxx11_((string *)&local_128,s_00);
          std::operator+(&l.first,"AUTHCHALLENGE SAFECOOKIE ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_128);
          local_180._M_f = (offset_in_TorController_to_subr)authchallenge_cb;
          local_180._8_8_ = 0;
          local_180._M_bound_args.
          super__Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
          super__Head_base<0UL,_TorController_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
               (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
          std::function<void(TorControlConnection&,TorControlReply_const&)>::
          function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                    ((function<void(TorControlConnection&,TorControlReply_const&)> *)&local_168,
                     &local_180);
          TorControlConnection::Command(_conn,&l.first,&local_168);
          std::_Function_base::~_Function_base(&local_168.super__Function_base);
          std::__cxx11::string::~string((string *)&l);
          std::__cxx11::string::~string((string *)&local_128);
        }
        else {
          logging_function_07._M_str = "protocolinfo_cb";
          logging_function_07._M_len = 0xf;
          source_file_07._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file_07._M_len = 0x5e;
          LogPrintFormatInternal<std::__cxx11::string,int>
                    (logging_function_07,source_file_07,0x25a,ALL,Info,
                     (ConstevalFormatString<2U>)0x6c0a6d,&cookiefile,&TOR_COOKIE_SIZE);
        }
      }
      else {
        logging_function_06._M_str = "protocolinfo_cb";
        logging_function_06._M_len = 0xf;
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_06._M_len = 0x5e;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_06,source_file_06,0x25c,ALL,Info,
                   (ConstevalFormatString<1U>)0x6c0ac0,&cookiefile);
      }
      ppVar10 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&m._M_t._M_impl.super__Rb_tree_header;
    }
    else {
      bVar4 = ::LogAcceptCategory((LogFlags)ppVar10,LVar8);
      if (bVar4) {
        logging_function_03._M_str = "protocolinfo_cb";
        logging_function_03._M_len = 0xf;
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_03._M_len = 0x5e;
        LogPrintFormatInternal<>
                  (logging_function_03,source_file_03,0x24c,TOR,Debug,
                   (ConstevalFormatString<0U>)0x6c09d8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&l,"AUTHENTICATE",(allocator<char> *)&local_168);
      local_128._M_unused._M_object = auth_cb;
      local_128._8_8_ = 0;
      local_118[0]._0_8_ = this;
      std::function<void(TorControlConnection&,TorControlReply_const&)>::
      function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                ((function<void(TorControlConnection&,TorControlReply_const&)> *)&m,
                 (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
                  *)&local_128);
      TorControlConnection::Command(_conn,&l.first,(ReplyHandlerCB *)&m);
      std::_Function_base::~_Function_base((_Function_base *)&m);
      ppVar10 = &l;
    }
LAB_003370a7:
    std::__cxx11::string::~string((string *)ppVar10);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&l,"HASHEDPASSWORD",(allocator<char> *)&m);
    ppVar10 = &l;
    sVar7 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&methods,&ppVar10->first);
    LVar8 = (Level)ppVar10;
    ppVar10 = &l;
    std::__cxx11::string::~string((string *)ppVar10);
    if (sVar7 != 0) {
      bVar4 = ::LogAcceptCategory((LogFlags)ppVar10,LVar8);
      if (bVar4) {
        logging_function_02._M_str = "protocolinfo_cb";
        logging_function_02._M_len = 0xf;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_02._M_len = 0x5e;
        LogPrintFormatInternal<>
                  (logging_function_02,source_file_02,0x245,TOR,Debug,
                   (ConstevalFormatString<0U>)0x6c0946);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&l,"\"",(allocator<char> *)&local_128);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m,"\\\"",(allocator<char> *)&local_168);
      util::ReplaceAll(&torpassword,&l.first,(string *)&m);
      std::__cxx11::string::~string((string *)&m);
      std::__cxx11::string::~string((string *)&l);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,
                     "AUTHENTICATE \"",&torpassword);
      std::operator+(&l.first,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &m,"\"");
      local_168.super__Function_base._M_functor._M_unused._M_object = auth_cb;
      local_168.super__Function_base._M_functor._8_8_ = 0;
      local_168.super__Function_base._M_manager = (_Manager_type)this;
      std::function<void(TorControlConnection&,TorControlReply_const&)>::
      function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                ((function<void(TorControlConnection&,TorControlReply_const&)> *)&local_128,
                 (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
                  *)&local_168);
      TorControlConnection::Command(_conn,&l.first,(ReplyHandlerCB *)&local_128);
      std::_Function_base::~_Function_base((_Function_base *)&local_128);
      std::__cxx11::string::~string((string *)&l);
      ppVar10 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&m;
      goto LAB_003370a7;
    }
    pcVar9 = 
    "tor: Password provided with -torpassword, but HASHEDPASSWORD authentication is not available\n"
    ;
    source_line = 0x249;
LAB_00336d6c:
    logging_function_04._M_str = "protocolinfo_cb";
    logging_function_04._M_len = 0xf;
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_04._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function_04,source_file_04,source_line,ALL,Info,
               (ConstevalFormatString<0U>)pcVar9);
  }
  std::__cxx11::string::~string((string *)&torpassword);
  std::__cxx11::string::~string((string *)&cookiefile);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&methods._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00337373:
  __stack_chk_fail();
}

Assistant:

void TorController::protocolinfo_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        std::set<std::string> methods;
        std::string cookiefile;
        /*
         * 250-AUTH METHODS=COOKIE,SAFECOOKIE COOKIEFILE="/home/x/.tor/control_auth_cookie"
         * 250-AUTH METHODS=NULL
         * 250-AUTH METHODS=HASHEDPASSWORD
         */
        for (const std::string &s : reply.lines) {
            std::pair<std::string,std::string> l = SplitTorReplyLine(s);
            if (l.first == "AUTH") {
                std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
                std::map<std::string,std::string>::iterator i;
                if ((i = m.find("METHODS")) != m.end()) {
                    std::vector<std::string> m_vec = SplitString(i->second, ',');
                    methods = std::set<std::string>(m_vec.begin(), m_vec.end());
                }
                if ((i = m.find("COOKIEFILE")) != m.end())
                    cookiefile = i->second;
            } else if (l.first == "VERSION") {
                std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
                std::map<std::string,std::string>::iterator i;
                if ((i = m.find("Tor")) != m.end()) {
                    LogDebug(BCLog::TOR, "Connected to Tor version %s\n", i->second);
                }
            }
        }
        for (const std::string &s : methods) {
            LogDebug(BCLog::TOR, "Supported authentication method: %s\n", s);
        }
        // Prefer NULL, otherwise SAFECOOKIE. If a password is provided, use HASHEDPASSWORD
        /* Authentication:
         *   cookie:   hex-encoded ~/.tor/control_auth_cookie
         *   password: "password"
         */
        std::string torpassword = gArgs.GetArg("-torpassword", "");
        if (!torpassword.empty()) {
            if (methods.count("HASHEDPASSWORD")) {
                LogDebug(BCLog::TOR, "Using HASHEDPASSWORD authentication\n");
                ReplaceAll(torpassword, "\"", "\\\"");
                _conn.Command("AUTHENTICATE \"" + torpassword + "\"", std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
            } else {
                LogPrintf("tor: Password provided with -torpassword, but HASHEDPASSWORD authentication is not available\n");
            }
        } else if (methods.count("NULL")) {
            LogDebug(BCLog::TOR, "Using NULL authentication\n");
            _conn.Command("AUTHENTICATE", std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
        } else if (methods.count("SAFECOOKIE")) {
            // Cookie: hexdump -e '32/1 "%02x""\n"'  ~/.tor/control_auth_cookie
            LogDebug(BCLog::TOR, "Using SAFECOOKIE authentication, reading cookie authentication from %s\n", cookiefile);
            std::pair<bool,std::string> status_cookie = ReadBinaryFile(fs::PathFromString(cookiefile), TOR_COOKIE_SIZE);
            if (status_cookie.first && status_cookie.second.size() == TOR_COOKIE_SIZE) {
                // _conn.Command("AUTHENTICATE " + HexStr(status_cookie.second), std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
                cookie = std::vector<uint8_t>(status_cookie.second.begin(), status_cookie.second.end());
                clientNonce = std::vector<uint8_t>(TOR_NONCE_SIZE, 0);
                GetRandBytes(clientNonce);
                _conn.Command("AUTHCHALLENGE SAFECOOKIE " + HexStr(clientNonce), std::bind(&TorController::authchallenge_cb, this, std::placeholders::_1, std::placeholders::_2));
            } else {
                if (status_cookie.first) {
                    LogPrintf("tor: Authentication cookie %s is not exactly %i bytes, as is required by the spec\n", cookiefile, TOR_COOKIE_SIZE);
                } else {
                    LogPrintf("tor: Authentication cookie %s could not be opened (check permissions)\n", cookiefile);
                }
            }
        } else if (methods.count("HASHEDPASSWORD")) {
            LogPrintf("tor: The only supported authentication mechanism left is password, but no password provided with -torpassword\n");
        } else {
            LogPrintf("tor: No supported authentication method\n");
        }
    } else {
        LogPrintf("tor: Requesting protocol info failed\n");
    }
}